

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O0

int __thiscall cmCTestBuildHandler::ProcessHandler(cmCTestBuildHandler *this)

{
  cmCTest *pcVar1;
  string_view val;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  ulong uVar5;
  reference pbVar6;
  long lVar7;
  reference pcVar8;
  string *psVar9;
  string local_2ad0 [32];
  undefined1 local_2ab0 [8];
  ostringstream cmCTestLog_msg_17;
  string local_2938 [32];
  undefined1 local_2918 [8];
  ostringstream cmCTestLog_msg_16;
  string local_27a0 [32];
  undefined1 local_2780 [8];
  ostringstream cmCTestLog_msg_15;
  cmDuration local_2608;
  undefined1 local_2600 [8];
  cmXMLWriter xml;
  undefined1 local_2588 [8];
  ostringstream cmCTestLog_msg_14;
  undefined1 local_2410 [8];
  cmGeneratedFileStream xofs;
  cmCTestBuildErrorWarning *evit_1;
  iterator __end2_5;
  iterator __begin2_5;
  t_ErrorsAndWarningsVector *__range2_5;
  cmCTestBuildErrorWarning *evit;
  iterator __end2_4;
  iterator __begin2_4;
  t_ErrorsAndWarningsVector *__range2_4;
  duration<long,_std::ratio<1L,_1000000000L>_> local_2160;
  type elapsed_build_time;
  string local_2150;
  string local_2130 [32];
  undefined1 local_2110 [8];
  ostringstream cmCTestLog_msg_13;
  bool local_1f91;
  int local_1f90;
  bool res;
  int retVal;
  allocator<char> local_1f61;
  string local_1f60;
  undefined1 local_1f40 [8];
  cmStringReplaceHelper colorRemover;
  string local_1c80;
  allocator<char> local_1c59;
  string local_1c58;
  string local_1c38;
  undefined1 local_1c18 [8];
  string bindir;
  string local_1bf0;
  string local_1bd0;
  allocator<char> local_1ba9;
  string local_1ba8;
  string local_1b88;
  undefined1 local_1b68 [8];
  string srcdir;
  string local_1b40;
  string local_1b20;
  string local_1b00 [32];
  undefined1 local_1ae0 [8];
  ostringstream cmCTestLog_msg_12;
  string *s_3;
  iterator __end2_3;
  iterator __begin2_3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_3;
  ostringstream local_1928 [8];
  ostringstream cmCTestLog_msg_11;
  string local_17b0 [32];
  undefined1 local_1790 [8];
  ostringstream cmCTestLog_msg_10;
  string *s_2;
  iterator __end2_2;
  iterator __begin2_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_2;
  ostringstream local_15d8 [8];
  ostringstream cmCTestLog_msg_9;
  string local_1460 [32];
  undefined1 local_1440 [8];
  ostringstream cmCTestLog_msg_8;
  string *s_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  ostringstream local_1288 [8];
  ostringstream cmCTestLog_msg_7;
  string local_1110 [32];
  undefined1 local_10f0 [8];
  ostringstream cmCTestLog_msg_6;
  string *s;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  ostringstream local_f38 [8];
  ostringstream cmCTestLog_msg_5;
  long local_dc0;
  size_type cc;
  undefined1 local_d98 [8];
  ostringstream cmCTestLog_msg_4;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_c20;
  time_point elapsed_time_start;
  cmGeneratedFileStream ofs;
  allocator<char> local_999;
  string local_998;
  string local_978;
  string *local_958;
  string *useLaunchers;
  undefined1 local_930 [8];
  ostringstream cmCTestLog_msg_3;
  allocator<char> local_7b1;
  string local_7b0;
  string local_790;
  string *local_770;
  string *buildDirectory;
  string local_760 [32];
  undefined1 local_740 [8];
  ostringstream cmCTestLog_msg_2;
  undefined1 local_5c8 [8];
  string makeCommand;
  undefined1 local_588 [8];
  ostringstream cmCTestLog_msg_1;
  undefined1 local_410 [8];
  cmCTestCompileErrorWarningRex r;
  int entry;
  duration<double,_std::ratio<1L,_1L>_> local_1c8;
  string local_1c0 [48];
  ostringstream local_190 [8];
  ostringstream cmCTestLog_msg;
  cmCTestBuildHandler *this_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar3 = std::operator<<((ostream *)local_190,"Build project");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::ostringstream::str();
  pcVar4 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
               ,0x12d,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  local_1c8.__r =
       (rep_conflict)cmCTest::GetRemainingTimeAllowed((this->super_cmCTestGenericHandler).CTest);
  r.RegularExpression._556_4_ = 2;
  std::chrono::duration<long,std::ratio<60l,1l>>::duration<int,void>
            ((duration<long,std::ratio<60l,1l>> *)&entry,(int *)&r.RegularExpression.field_0x22c);
  bVar2 = std::chrono::operator<(&local_1c8,(duration<long,_std::ratio<60L,_1L>_> *)&entry);
  if (bVar2) {
    this_local._4_4_ = 0;
  }
  else {
    r.RegularExpression.progsize = 0;
    while (cmCTestWarningErrorFileLine[r.RegularExpression.progsize].RegularExpressionString !=
           (char *)0x0) {
      cmCTestCompileErrorWarningRex::cmCTestCompileErrorWarningRex
                ((cmCTestCompileErrorWarningRex *)local_410);
      bVar2 = cmsys::RegularExpression::compile
                        ((RegularExpression *)&r,
                         cmCTestWarningErrorFileLine[r.RegularExpression.progsize].
                         RegularExpressionString);
      if (bVar2) {
        local_410._0_4_ = cmCTestWarningErrorFileLine[r.RegularExpression.progsize].FileIndex;
        local_410._4_4_ = cmCTestWarningErrorFileLine[r.RegularExpression.progsize].LineIndex;
        std::
        vector<cmCTestBuildHandler::cmCTestCompileErrorWarningRex,_std::allocator<cmCTestBuildHandler::cmCTestCompileErrorWarningRex>_>
        ::push_back(&this->ErrorWarningFileLineRegex,(value_type *)local_410);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_588);
        poVar3 = std::operator<<((ostream *)local_588,"Problem Compiling regular expression: ");
        poVar3 = std::operator<<(poVar3,cmCTestWarningErrorFileLine[r.RegularExpression.progsize].
                                        RegularExpressionString);
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x142,pcVar4,false);
        std::__cxx11::string::~string((string *)(makeCommand.field_2._M_local_buf + 8));
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_588);
      }
      cmCTestCompileErrorWarningRex::~cmCTestCompileErrorWarningRex
                ((cmCTestCompileErrorWarningRex *)local_410);
      r.RegularExpression.progsize = r.RegularExpression.progsize + 1;
    }
    GetMakeCommand_abi_cxx11_((string *)local_5c8,this);
    uVar5 = std::__cxx11::string::empty();
    if ((uVar5 & 1) == 0) {
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7b0,"BuildDirectory",&local_7b1);
      cmCTest::GetCTestConfiguration(&local_790,pcVar1,&local_7b0);
      std::__cxx11::string::~string((string *)&local_7b0);
      std::allocator<char>::~allocator(&local_7b1);
      local_770 = &local_790;
      uVar5 = std::__cxx11::string::empty();
      if ((uVar5 & 1) == 0) {
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_998,"UseLaunchers",&local_999);
        cmCTest::GetCTestConfiguration(&local_978,pcVar1,&local_998);
        std::__cxx11::string::~string((string *)&local_998);
        std::allocator<char>::~allocator(&local_999);
        local_958 = &local_978;
        val = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_958);
        bVar2 = cmIsOn(val);
        this->UseCTestLaunch = bVar2;
        cmGeneratedFileStream::cmGeneratedFileStream
                  ((cmGeneratedFileStream *)&elapsed_time_start,None);
        local_c20.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
        bVar2 = cmCTestGenericHandler::StartLogFile
                          (&this->super_cmCTestGenericHandler,"Build",
                           (cmGeneratedFileStream *)&elapsed_time_start);
        if (!bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d98);
          poVar3 = std::operator<<((ostream *)local_d98,"Cannot create build log file");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x161,pcVar4,false);
          std::__cxx11::string::~string((string *)&cc);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_d98);
        }
        for (local_dc0 = 0; cmCTestErrorMatches[local_dc0] != (char *)0x0; local_dc0 = local_dc0 + 1
            ) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const*&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &this->CustomErrorMatches,cmCTestErrorMatches + local_dc0);
        }
        for (local_dc0 = 0; cmCTestErrorExceptions[local_dc0] != (char *)0x0;
            local_dc0 = local_dc0 + 1) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const*&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &this->CustomErrorExceptions,cmCTestErrorExceptions + local_dc0);
        }
        for (local_dc0 = 0; cmCTestWarningMatches[local_dc0] != (char *)0x0;
            local_dc0 = local_dc0 + 1) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const*&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &this->CustomWarningMatches,cmCTestWarningMatches + local_dc0);
        }
        for (local_dc0 = 0; cmCTestWarningExceptions[local_dc0] != (char *)0x0;
            local_dc0 = local_dc0 + 1) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const*&>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &this->CustomWarningExceptions,cmCTestWarningExceptions + local_dc0);
        }
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
                  (&this->ErrorMatchRegex);
        std::__cxx11::ostringstream::ostringstream(local_f38);
        poVar3 = (ostream *)std::ostream::operator<<(local_f38,this);
        poVar3 = std::operator<<(poVar3,"Add this->ErrorMatchRegex");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x185,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
        std::__cxx11::string::~string((string *)&__range2);
        std::__cxx11::ostringstream::~ostringstream(local_f38);
        __end2 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(&this->CustomErrorMatches);
        s = (string *)
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end(&this->CustomErrorMatches);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                           *)&s), bVar2) {
          pbVar6 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end2);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_10f0);
          poVar3 = std::operator<<((ostream *)local_10f0,"Add this->CustomErrorMatches: ");
          poVar3 = std::operator<<(poVar3,(string *)pbVar6);
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x185,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string(local_1110);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_10f0);
          std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>::
          emplace_back<std::__cxx11::string_const&>
                    ((vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>> *)
                     &this->ErrorMatchRegex,pbVar6);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end2);
        }
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
                  (&this->ErrorExceptionRegex);
        std::__cxx11::ostringstream::ostringstream(local_1288);
        poVar3 = (ostream *)std::ostream::operator<<(local_1288,this);
        poVar3 = std::operator<<(poVar3,"Add this->ErrorExceptionRegex");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x187,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
        std::__cxx11::string::~string((string *)&__range2_1);
        std::__cxx11::ostringstream::~ostringstream(local_1288);
        __end2_1 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin(&this->CustomErrorExceptions);
        s_1 = (string *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(&this->CustomErrorExceptions);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end2_1,
                                  (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&s_1), bVar2) {
          pbVar6 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end2_1);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1440);
          poVar3 = std::operator<<((ostream *)local_1440,"Add this->CustomErrorExceptions: ");
          poVar3 = std::operator<<(poVar3,(string *)pbVar6);
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x187,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string(local_1460);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1440);
          std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>::
          emplace_back<std::__cxx11::string_const&>
                    ((vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>> *)
                     &this->ErrorExceptionRegex,pbVar6);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end2_1);
        }
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
                  (&this->WarningMatchRegex);
        std::__cxx11::ostringstream::ostringstream(local_15d8);
        poVar3 = (ostream *)std::ostream::operator<<(local_15d8,this);
        poVar3 = std::operator<<(poVar3,"Add this->WarningMatchRegex");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x189,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
        std::__cxx11::string::~string((string *)&__range2_2);
        std::__cxx11::ostringstream::~ostringstream(local_15d8);
        __end2_2 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin(&this->CustomWarningMatches);
        s_2 = (string *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(&this->CustomWarningMatches);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end2_2,
                                  (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&s_2), bVar2) {
          pbVar6 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end2_2);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1790);
          poVar3 = std::operator<<((ostream *)local_1790,"Add this->CustomWarningMatches: ");
          poVar3 = std::operator<<(poVar3,(string *)pbVar6);
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x189,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string(local_17b0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1790);
          std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>::
          emplace_back<std::__cxx11::string_const&>
                    ((vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>> *)
                     &this->WarningMatchRegex,pbVar6);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end2_2);
        }
        std::vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>::clear
                  (&this->WarningExceptionRegex);
        std::__cxx11::ostringstream::ostringstream(local_1928);
        poVar3 = (ostream *)std::ostream::operator<<(local_1928,this);
        poVar3 = std::operator<<(poVar3,"Add this->WarningExceptionRegex");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x18b,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
        std::__cxx11::string::~string((string *)&__range2_3);
        std::__cxx11::ostringstream::~ostringstream(local_1928);
        __end2_3 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin(&this->CustomWarningExceptions);
        s_3 = (string *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end(&this->CustomWarningExceptions);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end2_3,
                                  (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&s_3), bVar2) {
          pbVar6 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end2_3);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1ae0);
          poVar3 = std::operator<<((ostream *)local_1ae0,"Add this->CustomWarningExceptions: ");
          poVar3 = std::operator<<(poVar3,(string *)pbVar6);
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x18b,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string(local_1b00);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1ae0);
          std::vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>>::
          emplace_back<std::__cxx11::string_const&>
                    ((vector<cmsys::RegularExpression,std::allocator<cmsys::RegularExpression>> *)
                     &this->WarningExceptionRegex,pbVar6);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&__end2_3);
        }
        std::__cxx11::string::clear();
        std::__cxx11::string::clear();
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1b40,"SourceDirectory",
                   (allocator<char> *)(srcdir.field_2._M_local_buf + 0xf));
        cmCTest::GetCTestConfiguration(&local_1b20,pcVar1,&local_1b40);
        uVar5 = std::__cxx11::string::size();
        std::__cxx11::string::~string((string *)&local_1b20);
        std::__cxx11::string::~string((string *)&local_1b40);
        std::allocator<char>::~allocator((allocator<char> *)(srcdir.field_2._M_local_buf + 0xf));
        if (0x14 < uVar5) {
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1ba8,"SourceDirectory",&local_1ba9);
          cmCTest::GetCTestConfiguration(&local_1b88,pcVar1,&local_1ba8);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1b68,&local_1b88,"/");
          std::__cxx11::string::~string((string *)&local_1b88);
          std::__cxx11::string::~string((string *)&local_1ba8);
          std::allocator<char>::~allocator(&local_1ba9);
          std::__cxx11::string::size();
          lVar7 = std::__cxx11::string::rfind((char)local_1b68,0x2f);
          if (lVar7 != -1) {
            std::__cxx11::string::resize((ulong)local_1b68);
            std::__cxx11::string::operator=((string *)&this->SimplifySourceDir,(string *)local_1b68)
            ;
          }
          std::__cxx11::string::~string((string *)local_1b68);
        }
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1bf0,"BuildDirectory",
                   (allocator<char> *)(bindir.field_2._M_local_buf + 0xf));
        cmCTest::GetCTestConfiguration(&local_1bd0,pcVar1,&local_1bf0);
        uVar5 = std::__cxx11::string::size();
        std::__cxx11::string::~string((string *)&local_1bd0);
        std::__cxx11::string::~string((string *)&local_1bf0);
        std::allocator<char>::~allocator((allocator<char> *)(bindir.field_2._M_local_buf + 0xf));
        if (0x14 < uVar5) {
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1c58,"BuildDirectory",&local_1c59);
          cmCTest::GetCTestConfiguration(&local_1c38,pcVar1,&local_1c58);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1c18,&local_1c38,"/");
          std::__cxx11::string::~string((string *)&local_1c38);
          std::__cxx11::string::~string((string *)&local_1c58);
          std::allocator<char>::~allocator(&local_1c59);
          std::__cxx11::string::size();
          lVar7 = std::__cxx11::string::rfind((char)local_1c18,0x2f);
          if (lVar7 != -1) {
            std::__cxx11::string::resize((ulong)local_1c18);
            std::__cxx11::string::operator=((string *)&this->SimplifyBuildDir,(string *)local_1c18);
          }
          std::__cxx11::string::~string((string *)local_1c18);
        }
        cmCTest::CurrentTime_abi_cxx11_(&local_1c80,(this->super_cmCTestGenericHandler).CTest);
        std::__cxx11::string::operator=((string *)&this->StartBuild,(string *)&local_1c80);
        std::__cxx11::string::~string((string *)&local_1c80);
        colorRemover.Makefile = (cmMakefile *)std::chrono::_V2::system_clock::now();
        (this->StartBuildTime).__d.__r = (rep)colorRemover.Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1f60,"\x1b\\[[0-9;]*m",&local_1f61);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&retVal,"",(allocator<char> *)&res);
        cmStringReplaceHelper::cmStringReplaceHelper
                  ((cmStringReplaceHelper *)local_1f40,&local_1f60,(string *)&retVal,
                   (cmMakefile *)0x0);
        std::__cxx11::string::~string((string *)&retVal);
        std::allocator<char>::~allocator((allocator<char> *)&res);
        std::__cxx11::string::~string((string *)&local_1f60);
        std::allocator<char>::~allocator(&local_1f61);
        this->ColorRemover = (cmStringReplaceHelper *)local_1f40;
        local_1f90 = 0;
        local_1f91 = true;
        bVar2 = cmCTest::GetShowOnly((this->super_cmCTestGenericHandler).CTest);
        if (bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2110);
          poVar3 = std::operator<<((ostream *)local_2110,"Build with command: ");
          poVar3 = std::operator<<(poVar3,(string *)local_5c8);
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x1b3,pcVar4,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string(local_2130);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2110);
        }
        else {
          pcVar4 = (char *)std::__cxx11::string::c_str();
          local_1f91 = RunMakeCommand(this,(string *)local_5c8,&local_1f90,pcVar4,0,
                                      (ostream *)&elapsed_time_start,Auto);
        }
        cmCTest::CurrentTime_abi_cxx11_(&local_2150,(this->super_cmCTestGenericHandler).CTest);
        std::__cxx11::string::operator=((string *)&this->EndBuild,(string *)&local_2150);
        std::__cxx11::string::~string((string *)&local_2150);
        elapsed_build_time.__r = std::chrono::_V2::system_clock::now();
        (this->EndBuildTime).__d.__r = elapsed_build_time.__r;
        __range2_4 = (t_ErrorsAndWarningsVector *)std::chrono::_V2::steady_clock::now();
        local_2160.__r =
             (rep)std::chrono::operator-
                            ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              *)&__range2_4,&local_c20);
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          __end2_4 = std::
                     vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
                     ::begin(&this->ErrorsAndWarnings);
          evit = (cmCTestBuildErrorWarning *)
                 std::
                 vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
                 ::end(&this->ErrorsAndWarnings);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end2_4,
                                    (__normal_iterator<cmCTestBuildHandler::cmCTestBuildErrorWarning_*,_std::vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>_>
                                     *)&evit), bVar2) {
            pcVar8 = __gnu_cxx::
                     __normal_iterator<cmCTestBuildHandler::cmCTestBuildErrorWarning_*,_std::vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>_>
                     ::operator*(&__end2_4);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            cmsys::SystemTools::ReplaceString(&pcVar8->Text,pcVar4,"/.../");
            pcVar4 = (char *)std::__cxx11::string::c_str();
            cmsys::SystemTools::ReplaceString(&pcVar8->PreContext,pcVar4,"/.../");
            pcVar4 = (char *)std::__cxx11::string::c_str();
            cmsys::SystemTools::ReplaceString(&pcVar8->PostContext,pcVar4,"/.../");
            __gnu_cxx::
            __normal_iterator<cmCTestBuildHandler::cmCTestBuildErrorWarning_*,_std::vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>_>
            ::operator++(&__end2_4);
          }
        }
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          __end2_5 = std::
                     vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
                     ::begin(&this->ErrorsAndWarnings);
          evit_1 = (cmCTestBuildErrorWarning *)
                   std::
                   vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>
                   ::end(&this->ErrorsAndWarnings);
          while (bVar2 = __gnu_cxx::operator!=
                                   (&__end2_5,
                                    (__normal_iterator<cmCTestBuildHandler::cmCTestBuildErrorWarning_*,_std::vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>_>
                                     *)&evit_1), bVar2) {
            xofs._608_8_ = __gnu_cxx::
                           __normal_iterator<cmCTestBuildHandler::cmCTestBuildErrorWarning_*,_std::vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>_>
                           ::operator*(&__end2_5);
            psVar9 = &((reference)xofs._608_8_)->Text;
            pcVar4 = (char *)std::__cxx11::string::c_str();
            cmsys::SystemTools::ReplaceString(psVar9,pcVar4,"/.../");
            psVar9 = (string *)(xofs._608_8_ + 0x70);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            cmsys::SystemTools::ReplaceString(psVar9,pcVar4,"/.../");
            psVar9 = (string *)(xofs._608_8_ + 0x90);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            cmsys::SystemTools::ReplaceString(psVar9,pcVar4,"/.../");
            __gnu_cxx::
            __normal_iterator<cmCTestBuildHandler::cmCTestBuildErrorWarning_*,_std::vector<cmCTestBuildHandler::cmCTestBuildErrorWarning,_std::allocator<cmCTestBuildHandler::cmCTestBuildErrorWarning>_>_>
            ::operator++(&__end2_5);
          }
        }
        cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_2410,None);
        bVar2 = cmCTestGenericHandler::StartResultingXML
                          (&this->super_cmCTestGenericHandler,PartBuild,"Build",
                           (cmGeneratedFileStream *)local_2410);
        if (bVar2) {
          cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_2600,(ostream *)local_2410,0);
          GenerateXMLHeader(this,(cmXMLWriter *)local_2600);
          if ((this->UseCTestLaunch & 1U) == 0) {
            GenerateXMLLogScraped(this,(cmXMLWriter *)local_2600);
          }
          else {
            GenerateXMLLaunched(this,(cmXMLWriter *)local_2600);
          }
          std::chrono::duration<double,std::ratio<1l,1l>>::
          duration<long,std::ratio<1l,1000000000l>,void>
                    ((duration<double,std::ratio<1l,1l>> *)&local_2608,&local_2160);
          GenerateXMLFooter(this,(cmXMLWriter *)local_2600,local_2608);
          if (((local_1f91 == false) || (local_1f90 != 0)) || (0 < this->TotalErrors)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2780);
            poVar3 = std::operator<<((ostream *)local_2780,"Error(s) when building project");
            std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
            pcVar1 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::ostringstream::str();
            pcVar4 = (char *)std::__cxx11::string::c_str();
            cmCTest::Log(pcVar1,7,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                         ,0x1e5,pcVar4,false);
            std::__cxx11::string::~string(local_27a0);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2780);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2918);
          poVar3 = std::operator<<((ostream *)local_2918,"   ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->TotalErrors);
          pcVar4 = "";
          if (this->MaxErrors <= this->TotalErrors) {
            pcVar4 = " or more";
          }
          poVar3 = std::operator<<(poVar3,pcVar4);
          poVar3 = std::operator<<(poVar3," Compiler errors");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x1ec,pcVar4,false);
          std::__cxx11::string::~string(local_2938);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2918);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2ab0);
          poVar3 = std::operator<<((ostream *)local_2ab0,"   ");
          poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->TotalWarnings);
          pcVar4 = "";
          if (this->MaxWarnings <= this->TotalWarnings) {
            pcVar4 = " or more";
          }
          poVar3 = std::operator<<(poVar3,pcVar4);
          poVar3 = std::operator<<(poVar3," Compiler warnings");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x1f1,pcVar4,false);
          std::__cxx11::string::~string(local_2ad0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2ab0);
          this_local._4_4_ = local_1f90;
          buildDirectory._4_4_ = 1;
          cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_2600);
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2588);
          poVar3 = std::operator<<((ostream *)local_2588,"Cannot create build XML file");
          std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar4 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                       ,0x1d7,pcVar4,false);
          std::__cxx11::string::~string((string *)&xml.ElementOpen);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2588);
          this_local._4_4_ = -1;
          buildDirectory._4_4_ = 1;
        }
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_2410);
        cmStringReplaceHelper::~cmStringReplaceHelper((cmStringReplaceHelper *)local_1f40);
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&elapsed_time_start);
        std::__cxx11::string::~string((string *)&local_978);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_930);
        poVar3 = std::operator<<((ostream *)local_930,
                                 "Cannot find BuildDirectory  key in the DartConfiguration.tcl");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar4 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                     ,0x154,pcVar4,false);
        std::__cxx11::string::~string((string *)&useLaunchers);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_930);
        this_local._4_4_ = -1;
        buildDirectory._4_4_ = 1;
      }
      std::__cxx11::string::~string((string *)&local_790);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_740);
      poVar3 = std::operator<<((ostream *)local_740,
                               "Cannot find MakeCommand key in the DartConfiguration.tcl");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar4 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestBuildHandler.cxx"
                   ,0x14b,pcVar4,false);
      std::__cxx11::string::~string(local_760);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_740);
      this_local._4_4_ = -1;
      buildDirectory._4_4_ = 1;
    }
    std::__cxx11::string::~string((string *)local_5c8);
  }
  return this_local._4_4_;
}

Assistant:

int cmCTestBuildHandler::ProcessHandler()
{
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT, "Build project" << std::endl,
                     this->Quiet);

  // do we have time for this
  if (this->CTest->GetRemainingTimeAllowed() < std::chrono::minutes(2)) {
    return 0;
  }

  int entry;
  for (entry = 0; cmCTestWarningErrorFileLine[entry].RegularExpressionString;
       ++entry) {
    cmCTestBuildHandler::cmCTestCompileErrorWarningRex r;
    if (r.RegularExpression.compile(
          cmCTestWarningErrorFileLine[entry].RegularExpressionString)) {
      r.FileIndex = cmCTestWarningErrorFileLine[entry].FileIndex;
      r.LineIndex = cmCTestWarningErrorFileLine[entry].LineIndex;
      this->ErrorWarningFileLineRegex.push_back(std::move(r));
    } else {
      cmCTestLog(
        this->CTest, ERROR_MESSAGE,
        "Problem Compiling regular expression: "
          << cmCTestWarningErrorFileLine[entry].RegularExpressionString
          << std::endl);
    }
  }

  // Determine build command and build directory
  std::string makeCommand = this->GetMakeCommand();
  if (makeCommand.empty()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot find MakeCommand key in the DartConfiguration.tcl"
                 << std::endl);
    return -1;
  }

  const std::string& buildDirectory =
    this->CTest->GetCTestConfiguration("BuildDirectory");
  if (buildDirectory.empty()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot find BuildDirectory  key in the DartConfiguration.tcl"
                 << std::endl);
    return -1;
  }

  std::string const& useLaunchers =
    this->CTest->GetCTestConfiguration("UseLaunchers");
  this->UseCTestLaunch = cmIsOn(useLaunchers);

  // Create a last build log
  cmGeneratedFileStream ofs;
  auto elapsed_time_start = std::chrono::steady_clock::now();
  if (!this->StartLogFile("Build", ofs)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot create build log file" << std::endl);
  }

  // Create lists of regular expression strings for errors, error exceptions,
  // warnings and warning exceptions.
  std::vector<std::string>::size_type cc;
  for (cc = 0; cmCTestErrorMatches[cc]; cc++) {
    this->CustomErrorMatches.emplace_back(cmCTestErrorMatches[cc]);
  }
  for (cc = 0; cmCTestErrorExceptions[cc]; cc++) {
    this->CustomErrorExceptions.emplace_back(cmCTestErrorExceptions[cc]);
  }
  for (cc = 0; cmCTestWarningMatches[cc]; cc++) {
    this->CustomWarningMatches.emplace_back(cmCTestWarningMatches[cc]);
  }

  for (cc = 0; cmCTestWarningExceptions[cc]; cc++) {
    this->CustomWarningExceptions.emplace_back(cmCTestWarningExceptions[cc]);
  }

  // Pre-compile regular expressions objects for all regular expressions

#define cmCTestBuildHandlerPopulateRegexVector(strings, regexes)              \
  do {                                                                        \
    regexes.clear();                                                          \
    cmCTestOptionalLog(this->CTest, DEBUG,                                    \
                       this << "Add " #regexes << std::endl, this->Quiet);    \
    for (std::string const& s : (strings)) {                                  \
      cmCTestOptionalLog(this->CTest, DEBUG,                                  \
                         "Add " #strings ": " << s << std::endl,              \
                         this->Quiet);                                        \
      (regexes).emplace_back(s);                                              \
    }                                                                         \
  } while (false)

  cmCTestBuildHandlerPopulateRegexVector(this->CustomErrorMatches,
                                         this->ErrorMatchRegex);
  cmCTestBuildHandlerPopulateRegexVector(this->CustomErrorExceptions,
                                         this->ErrorExceptionRegex);
  cmCTestBuildHandlerPopulateRegexVector(this->CustomWarningMatches,
                                         this->WarningMatchRegex);
  cmCTestBuildHandlerPopulateRegexVector(this->CustomWarningExceptions,
                                         this->WarningExceptionRegex);

  // Determine source and binary tree substitutions to simplify the output.
  this->SimplifySourceDir.clear();
  this->SimplifyBuildDir.clear();
  if (this->CTest->GetCTestConfiguration("SourceDirectory").size() > 20) {
    std::string srcdir =
      this->CTest->GetCTestConfiguration("SourceDirectory") + "/";
    cc = srcdir.rfind('/', srcdir.size() - 2);
    if (cc != std::string::npos) {
      srcdir.resize(cc + 1);
      this->SimplifySourceDir = std::move(srcdir);
    }
  }
  if (this->CTest->GetCTestConfiguration("BuildDirectory").size() > 20) {
    std::string bindir =
      this->CTest->GetCTestConfiguration("BuildDirectory") + "/";
    cc = bindir.rfind('/', bindir.size() - 2);
    if (cc != std::string::npos) {
      bindir.resize(cc + 1);
      this->SimplifyBuildDir = std::move(bindir);
    }
  }

  // Ok, let's do the build

  // Remember start build time
  this->StartBuild = this->CTest->CurrentTime();
  this->StartBuildTime = std::chrono::system_clock::now();

  cmStringReplaceHelper colorRemover("\x1b\\[[0-9;]*m", "", nullptr);
  this->ColorRemover = &colorRemover;
  int retVal = 0;
  bool res = true;
  if (!this->CTest->GetShowOnly()) {
    res = this->RunMakeCommand(makeCommand, &retVal, buildDirectory.c_str(), 0,
                               ofs);
  } else {
    cmCTestOptionalLog(this->CTest, DEBUG,
                       "Build with command: " << makeCommand << std::endl,
                       this->Quiet);
  }

  // Remember end build time and calculate elapsed time
  this->EndBuild = this->CTest->CurrentTime();
  this->EndBuildTime = std::chrono::system_clock::now();
  auto elapsed_build_time =
    std::chrono::steady_clock::now() - elapsed_time_start;

  // Cleanups strings in the errors and warnings list.
  if (!this->SimplifySourceDir.empty()) {
    for (cmCTestBuildErrorWarning& evit : this->ErrorsAndWarnings) {
      cmSystemTools::ReplaceString(evit.Text, this->SimplifySourceDir.c_str(),
                                   "/.../");
      cmSystemTools::ReplaceString(evit.PreContext,
                                   this->SimplifySourceDir.c_str(), "/.../");
      cmSystemTools::ReplaceString(evit.PostContext,
                                   this->SimplifySourceDir.c_str(), "/.../");
    }
  }

  if (!this->SimplifyBuildDir.empty()) {
    for (cmCTestBuildErrorWarning& evit : this->ErrorsAndWarnings) {
      cmSystemTools::ReplaceString(evit.Text, this->SimplifyBuildDir.c_str(),
                                   "/.../");
      cmSystemTools::ReplaceString(evit.PreContext,
                                   this->SimplifyBuildDir.c_str(), "/.../");
      cmSystemTools::ReplaceString(evit.PostContext,
                                   this->SimplifyBuildDir.c_str(), "/.../");
    }
  }

  // Generate XML output
  cmGeneratedFileStream xofs;
  if (!this->StartResultingXML(cmCTest::PartBuild, "Build", xofs)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Cannot create build XML file" << std::endl);
    return -1;
  }
  cmXMLWriter xml(xofs);
  this->GenerateXMLHeader(xml);
  if (this->UseCTestLaunch) {
    this->GenerateXMLLaunched(xml);
  } else {
    this->GenerateXMLLogScraped(xml);
  }
  this->GenerateXMLFooter(xml, elapsed_build_time);

  if (!res || retVal || this->TotalErrors > 0) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Error(s) when building project" << std::endl);
  }

  // Display message about number of errors and warnings
  cmCTestLog(this->CTest, HANDLER_OUTPUT,
             "   " << this->TotalErrors
                   << (this->TotalErrors >= this->MaxErrors ? " or more" : "")
                   << " Compiler errors" << std::endl);
  cmCTestLog(
    this->CTest, HANDLER_OUTPUT,
    "   " << this->TotalWarnings
          << (this->TotalWarnings >= this->MaxWarnings ? " or more" : "")
          << " Compiler warnings" << std::endl);

  return retVal;
}